

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

lu_mem atomic(lua_State *L)

{
  global_State *g_00;
  GCObject *pGVar1;
  GCObject *f;
  int iVar2;
  lu_mem lVar3;
  lu_mem lVar4;
  lu_mem lVar5;
  lu_mem lVar6;
  lu_mem lVar7;
  GCObject *grayagain;
  GCObject *origall;
  GCObject *origweak;
  lu_mem work;
  global_State *g;
  lua_State *L_local;
  
  g_00 = L->l_G;
  pGVar1 = g_00->grayagain;
  g_00->grayagain = (GCObject *)0x0;
  g_00->gcstate = '\x02';
  if ((L->marked & 0x18) != 0) {
    reallymarkobject(g_00,(GCObject *)L);
  }
  if ((((g_00->l_registry).tt_ & 0x40) != 0) &&
     ((((g_00->l_registry).value_.gc)->marked & 0x18) != 0)) {
    reallymarkobject(g_00,(g_00->l_registry).value_.gc);
  }
  markmt(g_00);
  lVar3 = propagateall(g_00);
  iVar2 = remarkupvals(g_00);
  lVar4 = propagateall(g_00);
  g_00->gray = pGVar1;
  lVar5 = propagateall(g_00);
  convergeephemerons(g_00);
  clearbyvalues(g_00,g_00->weak,(GCObject *)0x0);
  clearbyvalues(g_00,g_00->allweak,(GCObject *)0x0);
  pGVar1 = g_00->weak;
  f = g_00->allweak;
  separatetobefnz(g_00,0);
  lVar6 = markbeingfnz(g_00);
  lVar7 = propagateall(g_00);
  convergeephemerons(g_00);
  clearbykeys(g_00,g_00->ephemeron);
  clearbykeys(g_00,g_00->allweak);
  clearbyvalues(g_00,g_00->weak,pGVar1);
  clearbyvalues(g_00,g_00->allweak,f);
  luaS_clearcache(g_00);
  g_00->currentwhite = g_00->currentwhite ^ 0x18;
  return lVar7 + lVar6 + lVar5 + lVar4 + (long)iVar2 + lVar3;
}

Assistant:

static lu_mem atomic (lua_State *L) {
  global_State *g = G(L);
  lu_mem work = 0;
  GCObject *origweak, *origall;
  GCObject *grayagain = g->grayagain;  /* save original list */
  g->grayagain = NULL;
  lua_assert(g->ephemeron == NULL && g->weak == NULL);
  lua_assert(!iswhite(g->mainthread));
  g->gcstate = GCSatomic;
  markobject(g, L);  /* mark running thread */
  /* registry and global metatables may be changed by API */
  markvalue(g, &g->l_registry);
  markmt(g);  /* mark global metatables */
  work += propagateall(g);  /* empties 'gray' list */
  /* remark occasional upvalues of (maybe) dead threads */
  work += remarkupvals(g);
  work += propagateall(g);  /* propagate changes */
  g->gray = grayagain;
  work += propagateall(g);  /* traverse 'grayagain' list */
  convergeephemerons(g);
  /* at this point, all strongly accessible objects are marked. */
  /* Clear values from weak tables, before checking finalizers */
  clearbyvalues(g, g->weak, NULL);
  clearbyvalues(g, g->allweak, NULL);
  origweak = g->weak; origall = g->allweak;
  separatetobefnz(g, 0);  /* separate objects to be finalized */
  work += markbeingfnz(g);  /* mark objects that will be finalized */
  work += propagateall(g);  /* remark, to propagate 'resurrection' */
  convergeephemerons(g);
  /* at this point, all resurrected objects are marked. */
  /* remove dead objects from weak tables */
  clearbykeys(g, g->ephemeron);  /* clear keys from all ephemeron tables */
  clearbykeys(g, g->allweak);  /* clear keys from all 'allweak' tables */
  /* clear values from resurrected weak tables */
  clearbyvalues(g, g->weak, origweak);
  clearbyvalues(g, g->allweak, origall);
  luaS_clearcache(g);
  g->currentwhite = cast_byte(otherwhite(g));  /* flip current white */
  lua_assert(g->gray == NULL);
  return work;  /* estimate of slots marked by 'atomic' */
}